

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O2

void __thiscall QuickImpl::CheckTimeout(QuickImpl *this)

{
  return;
}

Assistant:

void QuickImpl::CheckTimeout()
{
	// test
	return;

	auto now = dd::GetCurrentTickMicroSecond();
	AutoLock lock(_quick_lock);
	if (!_as_server) {
		for (auto iter = _connections.begin(); iter != _connections.end(); iter++) {
			if(!iter->second->server_state() || now - iter->second->latest_recv_msg_time() < CONNECTION_TIMEOUT_US)
				continue;
			iter->second->SetServerState(false);
			_quick_cb->OnDisconnected(iter->first);
			g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "session %u recv msg timeout, disconnect!", iter->first);
		}
	}
	else {
		for (auto iter = _connections.begin(); iter != _connections.end();) {
			if(!iter->second->server_state() || now - iter->second->latest_recv_msg_time() < CONNECTION_TIMEOUT_US)
				continue;
			iter->second->SetServerState(false);
			_quick_cb->OnDisconnected(iter->first);
			g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "session %u recv msg timeout, disconnect!", iter->first);
			iter->second->Disconnect();
			iter = _connections.erase(iter);
		}
	}
}